

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::
pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
::reserve(pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
          *this,size_type n)

{
  pointer plVar1;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::
             new_allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>
             ::allocate((new_allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>
                         *)this,(ulong)n,(void *)0x0);
    plVar1 = (this->ebo_).buf;
    if (plVar1 != (pointer)0x0) {
      memcpy(__dest,plVar1,(ulong)(this->ebo_).size * 0x18);
    }
    plVar1 = (this->ebo_).buf;
    if (plVar1 != (pointer)0x0) {
      operator_delete(plVar1);
    }
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}